

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniminer_tests.cpp
# Opt level: O3

void __thiscall miniminer_tests::calculate_cluster::test_method(calculate_cluster *this)

{
  uchar *puVar1;
  CTxMemPool *this_00;
  pointer psVar2;
  element_type *peVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  _func_int **pp_Var7;
  __normal_iterator<_a80fa006_> __first;
  void *pvVar8;
  uint256 *puVar9;
  pointer ptVar10;
  unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *puVar11;
  const_iterator cVar12;
  int iVar13;
  long lVar14;
  pointer __k;
  pointer puVar15;
  char *pcVar16;
  iterator pvVar17;
  iterator in_R9;
  iterator pvVar18;
  pointer phVar19;
  pointer ptVar20;
  long in_FS_OFFSET;
  initializer_list<COutPoint> __l;
  initializer_list<uint256> __l_00;
  const_string file;
  const_string file_00;
  initializer_list<COutPoint> __l_01;
  initializer_list<uint256> __l_02;
  const_string file_01;
  initializer_list<COutPoint> __l_03;
  initializer_list<COutPoint> __l_04;
  initializer_list<unsigned_long> __l_05;
  initializer_list<uint256> __l_06;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  Span<unsigned_char> bytes;
  check_type cVar21;
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  long **local_410;
  CTransactionRef txp;
  shared_count sStack_3f8;
  _Base_ptr local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  long **local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
  cluster;
  vector<unsigned_long,_std::allocator<unsigned_long>_> indices;
  vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
  vec_iters_zigzag;
  vector<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
  zigzag_txids;
  _Base_ptr local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
  cluster_501;
  CTransactionRef tx_501;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
  vec_iters_500;
  _Base_ptr local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
  cluster_500tx;
  vector<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_> chain_txids
  ;
  TestMemPoolEntryHelper entry;
  undefined8 ***local_210;
  CTransactionRef txc;
  shared_count sStack_1f8;
  _Base_ptr local_1f0;
  undefined1 local_1e8 [16];
  _Base_ptr local_1d8;
  assertion_result local_1d0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  setEntries cluster_500tx_set;
  setEntries clusterset;
  undefined8 uStack_12c;
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  a_Stack_128 [4];
  CTransactionRef tx;
  shared_count local_48;
  _Base_ptr p_Stack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar16 = "m_node.mempool";
  puVar11 = inline_assertion_check<true,std::unique_ptr<CTxMemPool,std::default_delete<CTxMemPool>>&>
                      (&(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
                        super_BasicTestingSetup.m_node.mempool,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
                       ,0x24e,"test_method","m_node.mempool");
  this_00 = (puVar11->_M_t).super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t
            .super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  criticalblock1.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock1.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock1.super_unique_lock);
  criticalblock2.super_unique_lock._M_device = &(this_00->cs).super_recursive_mutex;
  criticalblock2.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock2.super_unique_lock);
  entry.nFee = 0;
  entry.time.__d.__r = (duration)0;
  entry.nHeight = 1;
  entry.m_sequence = 0;
  entry.spendsCoinbase = false;
  entry.sigOpCost = 4;
  entry.lp.height = 0;
  entry.lp.time = 0;
  entry.lp.maxInputBlock = (CBlockIndex *)0x0;
  chain_txids.
  super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  chain_txids.
  super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  chain_txids.
  super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  psVar2 = (this->super_TestChain100Setup).m_coinbase_txns.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar13 = 500;
  do {
    peVar3 = (psVar2->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    clusterset._M_t._M_impl._0_8_ = *(undefined8 *)&(peVar3->hash).m_wrapped;
    clusterset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         *(undefined8 *)((long)&peVar3->hash + 8);
    clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         *(_Base_ptr *)((long)&peVar3->hash + 0x10);
    clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         *(_Base_ptr *)((long)&peVar3->hash + 0x18);
    clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ = 0;
    __l._M_len = 1;
    __l._M_array = (iterator)&clusterset;
    std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
              ((vector<COutPoint,_std::allocator<COutPoint>_> *)&cluster_500tx_set,__l,
               (allocator_type *)&txc);
    make_tx((miniminer_tests *)&tx,
            (vector<COutPoint,_std::allocator<COutPoint>_> *)&cluster_500tx_set,1);
    if (cluster_500tx_set._M_t._M_impl._0_8_ != 0) {
      operator_delete((void *)cluster_500tx_set._M_t._M_impl._0_8_,
                      (long)cluster_500tx_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                      - cluster_500tx_set._M_t._M_impl._0_8_);
    }
    entry.nFee = 1000000;
    TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&clusterset,&entry,&tx);
    CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&clusterset);
    std::
    _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
    ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                 *)((long)register0x00000020 + -0x128));
    std::
    _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
    ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                 *)&clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    if (clusterset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 clusterset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
    }
    if (chain_txids.
        super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        chain_txids.
        super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<transaction_identifier<false>,std::allocator<transaction_identifier<false>>>::
      _M_realloc_insert<transaction_identifier<false>const&>
                ((vector<transaction_identifier<false>,std::allocator<transaction_identifier<false>>>
                  *)&chain_txids,
                 (iterator)
                 chain_txids.
                 super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 &(tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash);
    }
    else {
      uVar4 = *(undefined8 *)
               ((tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash
               ).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      uVar5 = *(undefined8 *)
               (((tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      uVar6 = *(undefined8 *)
               (((tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      *(undefined8 *)
       (((chain_txids.
          super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->m_wrapped).super_base_blob<256U>.m_data.
        _M_elems + 0x10) =
           *(undefined8 *)
            (((tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
             m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      *(undefined8 *)
       (((chain_txids.
          super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->m_wrapped).super_base_blob<256U>.m_data.
        _M_elems + 0x18) = uVar6;
      *(undefined8 *)
       ((chain_txids.
         super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)->m_wrapped).super_base_blob<256U>.m_data.
       _M_elems = uVar4;
      *(undefined8 *)
       (((chain_txids.
          super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->m_wrapped).super_base_blob<256U>.m_data.
        _M_elems + 8) = uVar5;
      chain_txids.
      super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           chain_txids.
           super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    (psVar2->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(psVar2->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount,
               &tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    iVar13 = iVar13 + -1;
  } while (iVar13 != 0);
  peVar3 = (psVar2->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  clusterset._M_t._M_impl._0_8_ = *(undefined8 *)&(peVar3->hash).m_wrapped;
  clusterset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)((long)&peVar3->hash + 8);
  clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)((long)&peVar3->hash + 0x10);
  clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       *(_Base_ptr *)((long)&peVar3->hash + 0x18);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&clusterset;
  std::vector<uint256,_std::allocator<uint256>_>::vector
            ((vector<uint256,_std::allocator<uint256>_> *)&cluster_500tx_set,__l_00,
             (allocator_type *)&tx);
  CTxMemPool::GatherClusters
            (&cluster_500tx,this_00,(vector<uint256,_std::allocator<uint256>_> *)&cluster_500tx_set)
  ;
  if (cluster_500tx_set._M_t._M_impl._0_8_ != 0) {
    operator_delete((void *)cluster_500tx_set._M_t._M_impl._0_8_,
                    (long)cluster_500tx_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent -
                    cluster_500tx_set._M_t._M_impl._0_8_);
  }
  std::
  set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,CompareIteratorByHash,std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>
  ::
  set<__gnu_cxx::__normal_iterator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>const*,std::vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost___i_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>>>
            ((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,CompareIteratorByHash,std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>
              *)&cluster_500tx_set,
             (__normal_iterator<_a80fa006_>)
             cluster_500tx.
             super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<_a80fa006_>)
             cluster_500tx.
             super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_298 = "";
  local_2b0 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x265;
  file.m_begin = (iterator)&local_2a0;
  msg.m_end = in_R9;
  msg.m_begin = pcVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2b0,msg);
  txc.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       txc.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi &
       0xffffffffffffff00;
  txc.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__lazy_ostream_013ae088;
  sStack_1f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1f0 = (_Base_ptr)0xf73bdc;
  zigzag_txids.
  super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)cluster_500tx.
                       super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)cluster_500tx.
                       super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3);
  vec_iters_500.
  super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&zigzag_txids;
  txp.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT71(txp.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr._1_7_,
                zigzag_txids.
                super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                (pointer)cluster_500tx_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cluster_501.
  super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&vec_iters_zigzag;
  vec_iters_zigzag.
  super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)cluster_500tx_set._M_t._M_impl.super__Rb_tree_header._M_node_count;
  txp.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  sStack_3f8.pi_ = (sp_counted_base *)0x0;
  local_1d0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_1d0.m_message.px = (element_type *)0xeaa460;
  clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&vec_iters_500;
  clusterset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       clusterset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  clusterset._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ae0c8;
  clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  p_Stack_40 = (_Base_ptr)&cluster_501;
  tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi &
       0xffffffffffffff00;
  tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__lazy_ostream_013ae0c8;
  local_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar17 = (iterator)0x1;
  pvVar18 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&txp,(lazy_ostream *)&txc,1,2,REQUIRE,0xeab1aa,(size_t)&local_1d0,
             0x265,&clusterset,"cluster_500tx_set.size()",(allocator_type *)&tx);
  boost::detail::shared_count::~shared_count(&sStack_3f8);
  ptVar10 = chain_txids.
            super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48.pi_ = (sp_counted_base *)0x0;
  if (chain_txids.
      super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      chain_txids.
      super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ptVar20 = chain_txids.
              super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      puVar9 = &ptVar20->m_wrapped;
      clusterset._M_t._M_impl._0_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[0];
      clusterset._M_t._M_impl._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
      clusterset._M_t._M_impl._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
      clusterset._M_t._M_impl._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
      clusterset._M_t._M_impl._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
      clusterset._M_t._M_impl._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
      clusterset._M_t._M_impl._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
      clusterset._M_t._M_impl._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
      clusterset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           *(undefined8 *)((ptVar20->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
      clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           *(_Base_ptr *)((ptVar20->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
      clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           *(_Base_ptr *)((ptVar20->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
      if (tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.pi_) {
        std::vector<uint256,_std::allocator<uint256>_>::_M_realloc_insert<uint256>
                  ((vector<uint256,_std::allocator<uint256>_> *)&tx,
                   (iterator)
                   tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi,(uint256 *)&clusterset);
      }
      else {
        pp_Var7 = *(_func_int ***)(ptVar20->m_wrapped).super_base_blob<256U>.m_data._M_elems;
        uVar4 = *(undefined8 *)((ptVar20->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
        uVar5 = *(undefined8 *)((ptVar20->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
        tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
        _vptr__Sp_counted_base =
             *(_func_int ***)((ptVar20->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
        tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
        _M_use_count = (int)uVar5;
        tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
        _M_weak_count = (int)((ulong)uVar5 >> 0x20);
        (tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base = pp_Var7;
        (tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (int)uVar4;
        (tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_weak_count = (int)((ulong)uVar4 >> 0x20);
        tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             + 2;
      }
      ptVar20 = ptVar20 + 1;
    } while (ptVar20 != ptVar10);
  }
  CTxMemPool::GetIterVec(&vec_iters_500,this_00,(vector<uint256,_std::allocator<uint256>_> *)&tx);
  if (tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    operator_delete(tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (long)local_48.pi_ -
                    (long)tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
  }
  if (vec_iters_500.
      super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      vec_iters_500.
      super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    phVar19 = vec_iters_500.
              super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_2d8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_2d0 = "";
      local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0x267;
      file_00.m_begin = (iterator)&local_2d8;
      msg_00.m_end = pvVar18;
      msg_00.m_begin = pvVar17;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2e8,
                 msg_00);
      _cVar21 = 0x45990a;
      cVar12 = std::_Rb_tree<$270907ca$>::find(&cluster_500tx_set._M_t,phVar19);
      tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           CONCAT71(tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                    _1_7_,(_Rb_tree_header *)cVar12._M_node !=
                          &cluster_500tx_set._M_t._M_impl.super__Rb_tree_header);
      tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_48.pi_ = (sp_counted_base *)0x0;
      txc.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)anon_var_dwarf_cfd430;
      txc.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xeab1f5;
      clusterset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           clusterset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
      clusterset._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ae1c8;
      clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)boost::unit_test::lazy_ostream::inst;
      clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&txc;
      local_2f8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_2f0 = "";
      pvVar17 = (iterator)0x1;
      pvVar18 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&tx,(lazy_ostream *)&clusterset,1,0,WARN,_cVar21,
                 (size_t)&local_2f8,0x267);
      boost::detail::shared_count::~shared_count(&local_48);
      phVar19 = phVar19 + 1;
    } while (phVar19 !=
             vec_iters_500.
             super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  peVar3 = (psVar2->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  clusterset._M_t._M_impl._0_8_ = *(undefined8 *)&(peVar3->hash).m_wrapped;
  clusterset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)((long)&peVar3->hash + 8);
  clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)((long)&peVar3->hash + 0x10);
  clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       *(_Base_ptr *)((long)&peVar3->hash + 0x18);
  clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ = 0;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&clusterset;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)&tx,__l_01,(allocator_type *)&txc);
  make_tx((miniminer_tests *)&tx_501,(vector<COutPoint,_std::allocator<COutPoint>_> *)&tx,1);
  if (tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    operator_delete(tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (long)local_48.pi_ -
                    (long)tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
  }
  entry.nFee = 1000000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&clusterset,&entry,&tx_501);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&clusterset);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)((long)register0x00000020 + -0x128));
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  if (clusterset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               clusterset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
  }
  puVar9 = &((tx_501.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            hash).m_wrapped;
  clusterset._M_t._M_impl._0_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[0];
  clusterset._M_t._M_impl._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
  clusterset._M_t._M_impl._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
  clusterset._M_t._M_impl._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
  clusterset._M_t._M_impl._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
  clusterset._M_t._M_impl._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
  clusterset._M_t._M_impl._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
  clusterset._M_t._M_impl._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
  clusterset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)
        (((tx_501.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)
        (((tx_501.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       *(_Base_ptr *)
        (((tx_501.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash).
         m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&clusterset;
  std::vector<uint256,_std::allocator<uint256>_>::vector
            ((vector<uint256,_std::allocator<uint256>_> *)&tx,__l_02,(allocator_type *)&txc);
  CTxMemPool::GatherClusters(&cluster_501,this_00,(vector<uint256,_std::allocator<uint256>_> *)&tx);
  if (tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    operator_delete(tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (long)local_48.pi_ -
                    (long)tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
  }
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_328 = "";
  local_340 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x26d;
  file_01.m_begin = (iterator)&local_330;
  msg_01.m_end = pvVar18;
  msg_01.m_begin = pvVar17;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_340,
             msg_01);
  indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)cluster_501.
                       super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)cluster_501.
                       super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3);
  txc.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       txc.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi &
       0xffffffffffffff00;
  txc.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__lazy_ostream_013ae088;
  sStack_1f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1f0 = (_Base_ptr)0xf73bdc;
  zigzag_txids.
  super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&indices;
  vec_iters_zigzag.
  super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&cluster;
  cluster.
  super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  txp.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT71(txp.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr._1_7_,
                cluster_501.
                super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                cluster_501.
                super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                ._M_impl.super__Vector_impl_data._M_start);
  txp.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  sStack_3f8.pi_ = (sp_counted_base *)0x0;
  local_1d0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_1d0.m_message.px = (element_type *)0xeaa460;
  clusterset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       clusterset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  clusterset._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ae0c8;
  clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&zigzag_txids;
  tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi &
       0xffffffffffffff00;
  tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__lazy_ostream_013ae248;
  local_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  p_Stack_40 = (_Base_ptr)&vec_iters_zigzag;
  pvVar17 = (iterator)0x1;
  pvVar18 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&txp,(lazy_ostream *)&txc,1,2,REQUIRE,0xeab1f6,(size_t)&local_1d0,
             0x26d,&clusterset,"0",(vector<uint256,_std::allocator<uint256>_> *)&tx);
  boost::detail::shared_count::~shared_count(&sStack_3f8);
  zigzag_txids.
  super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  zigzag_txids.
  super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  zigzag_txids.
  super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar13 = 0x32;
  do {
    local_48.pi_ = (sp_counted_base *)0x0;
    p_Stack_40 = (_Base_ptr)0x0;
    tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    bytes.m_size = 0x20;
    bytes.m_data = (uchar *)&tx;
    GetRandBytes(bytes);
    clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_48.pi_;
    clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Stack_40;
    clusterset._M_t._M_impl._0_8_ =
         tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    clusterset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ = 0;
    __l_03._M_len = 1;
    __l_03._M_array = (iterator)&clusterset;
    std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
              ((vector<COutPoint,_std::allocator<COutPoint>_> *)&txc,__l_03,
               (allocator_type *)&local_1d0);
    make_tx((miniminer_tests *)&txp,(vector<COutPoint,_std::allocator<COutPoint>_> *)&txc,2);
    if (txc.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      operator_delete(txc.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      (long)sStack_1f8.pi_ -
                      (long)txc.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
    }
    entry.nFee = 1000000;
    TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&clusterset,&entry,&txp);
    CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&clusterset);
    std::
    _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
    ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                 *)((long)register0x00000020 + -0x128));
    std::
    _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
    ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                 *)&clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    if (clusterset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 clusterset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
    }
    if (zigzag_txids.
        super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        zigzag_txids.
        super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<transaction_identifier<false>,std::allocator<transaction_identifier<false>>>::
      _M_realloc_insert<transaction_identifier<false>const&>
                ((vector<transaction_identifier<false>,std::allocator<transaction_identifier<false>>>
                  *)&zigzag_txids,
                 (iterator)
                 zigzag_txids.
                 super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 &(txp.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash);
    }
    else {
      uVar4 = *(undefined8 *)
               ((txp.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      uVar5 = *(undefined8 *)
               (((txp.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      uVar6 = *(undefined8 *)
               (((txp.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      *(undefined8 *)
       (((zigzag_txids.
          super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->m_wrapped).super_base_blob<256U>.m_data.
        _M_elems + 0x10) =
           *(undefined8 *)
            (((txp.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      *(undefined8 *)
       (((zigzag_txids.
          super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->m_wrapped).super_base_blob<256U>.m_data.
        _M_elems + 0x18) = uVar6;
      *(undefined8 *)
       ((zigzag_txids.
         super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)->m_wrapped).super_base_blob<256U>.m_data.
       _M_elems = uVar4;
      *(undefined8 *)
       (((zigzag_txids.
          super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->m_wrapped).super_base_blob<256U>.m_data.
        _M_elems + 8) = uVar5;
      zigzag_txids.
      super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           zigzag_txids.
           super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    if (txp.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (txp.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    iVar13 = iVar13 + -1;
  } while (iVar13 != 0);
  lVar14 = 0x20;
  do {
    puVar1 = zigzag_txids.
             super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
             ._M_impl.super__Vector_impl_data._M_start[-1].m_wrapped.super_base_blob<256U>.m_data.
             _M_elems + lVar14;
    clusterset._M_t._M_impl._0_1_ = puVar1[0];
    clusterset._M_t._M_impl._1_1_ = puVar1[1];
    clusterset._M_t._M_impl._2_1_ = puVar1[2];
    clusterset._M_t._M_impl._3_1_ = puVar1[3];
    clusterset._M_t._M_impl._4_1_ = puVar1[4];
    clusterset._M_t._M_impl._5_1_ = puVar1[5];
    clusterset._M_t._M_impl._6_1_ = puVar1[6];
    clusterset._M_t._M_impl._7_1_ = puVar1[7];
    clusterset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = *(undefined8 *)(puVar1 + 8);
    puVar1 = ((zigzag_txids.
               super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->m_wrapped).super_base_blob<256U>.m_data.
             _M_elems + lVar14 + -0x10;
    clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = *(_Base_ptr *)puVar1;
    clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_left = *(_Base_ptr *)(puVar1 + 8);
    clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ = 1;
    puVar1 = ((zigzag_txids.
               super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->m_wrapped).super_base_blob<256U>.m_data.
             _M_elems + lVar14;
    uVar4 = *(undefined8 *)puVar1;
    uStack_12c = *(undefined8 *)
                  (((zigzag_txids.
                     super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_wrapped).super_base_blob<256U>.
                   m_data._M_elems + lVar14 + 0x18);
    clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ = (undefined4)uVar4;
    clusterset._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
         (undefined4)((ulong)uVar4 >> 0x20);
    clusterset._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
         (undefined4)*(undefined8 *)(puVar1 + 8);
    a_Stack_128[0]._M_impl._4_4_ = 0;
    __l_04._M_len = 2;
    __l_04._M_array = (iterator)&clusterset;
    std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
              ((vector<COutPoint,_std::allocator<COutPoint>_> *)&tx,__l_04,(allocator_type *)&txp);
    make_tx((miniminer_tests *)&txc,(vector<COutPoint,_std::allocator<COutPoint>_> *)&tx,1);
    if (tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      operator_delete(tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      (long)local_48.pi_ -
                      (long)tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
    }
    entry.nFee = 1000000;
    TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&clusterset,&entry,&txc);
    CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)&clusterset);
    std::
    _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
    ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                 *)((long)register0x00000020 + -0x128));
    std::
    _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
    ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                 *)&clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    if (clusterset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 clusterset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
    }
    if (zigzag_txids.
        super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        zigzag_txids.
        super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<transaction_identifier<false>,std::allocator<transaction_identifier<false>>>::
      _M_realloc_insert<transaction_identifier<false>const&>
                ((vector<transaction_identifier<false>,std::allocator<transaction_identifier<false>>>
                  *)&zigzag_txids,
                 (iterator)
                 zigzag_txids.
                 super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 &(txc.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash);
    }
    else {
      uVar4 = *(undefined8 *)
               ((txc.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      uVar5 = *(undefined8 *)
               (((txc.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      uVar6 = *(undefined8 *)
               (((txc.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      *(undefined8 *)
       (((zigzag_txids.
          super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->m_wrapped).super_base_blob<256U>.m_data.
        _M_elems + 0x10) =
           *(undefined8 *)
            (((txc.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash)
             .m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      *(undefined8 *)
       (((zigzag_txids.
          super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->m_wrapped).super_base_blob<256U>.m_data.
        _M_elems + 0x18) = uVar6;
      *(undefined8 *)
       ((zigzag_txids.
         super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)->m_wrapped).super_base_blob<256U>.m_data.
       _M_elems = uVar4;
      *(undefined8 *)
       (((zigzag_txids.
          super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->m_wrapped).super_base_blob<256U>.m_data.
        _M_elems + 8) = uVar5;
      zigzag_txids.
      super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           zigzag_txids.
           super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    if (txc.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (txc.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    ptVar10 = zigzag_txids.
              super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0x640);
  tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48.pi_ = (sp_counted_base *)0x0;
  if (zigzag_txids.
      super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      zigzag_txids.
      super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ptVar20 = zigzag_txids.
              super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      puVar9 = &ptVar20->m_wrapped;
      clusterset._M_t._M_impl._0_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[0];
      clusterset._M_t._M_impl._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
      clusterset._M_t._M_impl._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
      clusterset._M_t._M_impl._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
      clusterset._M_t._M_impl._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
      clusterset._M_t._M_impl._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
      clusterset._M_t._M_impl._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
      clusterset._M_t._M_impl._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
      clusterset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           *(undefined8 *)((ptVar20->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
      clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           *(_Base_ptr *)((ptVar20->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
      clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           *(_Base_ptr *)((ptVar20->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
      if (tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.pi_) {
        std::vector<uint256,_std::allocator<uint256>_>::_M_realloc_insert<uint256>
                  ((vector<uint256,_std::allocator<uint256>_> *)&tx,
                   (iterator)
                   tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi,(uint256 *)&clusterset);
      }
      else {
        pp_Var7 = *(_func_int ***)(ptVar20->m_wrapped).super_base_blob<256U>.m_data._M_elems;
        uVar4 = *(undefined8 *)((ptVar20->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
        uVar5 = *(undefined8 *)((ptVar20->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
        tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
        _vptr__Sp_counted_base =
             *(_func_int ***)((ptVar20->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
        tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
        _M_use_count = (int)uVar5;
        tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
        _M_weak_count = (int)((ulong)uVar5 >> 0x20);
        (tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base = pp_Var7;
        (tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (int)uVar4;
        (tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_weak_count = (int)((ulong)uVar4 >> 0x20);
        tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             + 2;
      }
      ptVar20 = ptVar20 + 1;
    } while (ptVar20 != ptVar10);
  }
  CTxMemPool::GetIterVec(&vec_iters_zigzag,this_00,(vector<uint256,_std::allocator<uint256>_> *)&tx)
  ;
  if (tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    operator_delete(tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (long)local_48.pi_ -
                    (long)tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
  }
  clusterset._M_t._M_impl._0_8_ = 0;
  clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0x16;
  clusterset._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x48;
  clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)
       (((long)zigzag_txids.
               super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)zigzag_txids.
               super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 5) + -1);
  __l_05._M_len = 4;
  __l_05._M_array = (iterator)&clusterset;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&indices,__l_05,(allocator_type *)&tx);
  if (indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar15 = indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      puVar9 = &zigzag_txids.
                super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                ._M_impl.super__Vector_impl_data._M_start[*puVar15].m_wrapped;
      clusterset._M_t._M_impl._0_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[0];
      clusterset._M_t._M_impl._1_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[1];
      clusterset._M_t._M_impl._2_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[2];
      clusterset._M_t._M_impl._3_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[3];
      clusterset._M_t._M_impl._4_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[4];
      clusterset._M_t._M_impl._5_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[5];
      clusterset._M_t._M_impl._6_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[6];
      clusterset._M_t._M_impl._7_1_ = (puVar9->super_base_blob<256U>).m_data._M_elems[7];
      clusterset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           *(undefined8 *)
            (zigzag_txids.
             super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
             ._M_impl.super__Vector_impl_data._M_start[*puVar15].m_wrapped.super_base_blob<256U>.
             m_data._M_elems + 8);
      puVar1 = zigzag_txids.
               super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
               ._M_impl.super__Vector_impl_data._M_start[*puVar15].m_wrapped.super_base_blob<256U>.
               m_data._M_elems + 0x10;
      clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = *(_Base_ptr *)puVar1;
      clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_left = *(_Base_ptr *)(puVar1 + 8);
      __l_06._M_len = 1;
      __l_06._M_array = (iterator)&clusterset;
      std::vector<uint256,_std::allocator<uint256>_>::vector
                ((vector<uint256,_std::allocator<uint256>_> *)&tx,__l_06,(allocator_type *)&txc);
      CTxMemPool::GatherClusters(&cluster,this_00,(vector<uint256,_std::allocator<uint256>_> *)&tx);
      if (tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        operator_delete(tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        ,(long)local_48.pi_ -
                         (long)tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
      }
      local_3b0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_3a8 = "";
      local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_02.m_end = (iterator)0x285;
      file_02.m_begin = (iterator)&local_3b0;
      msg_02.m_end = pvVar18;
      msg_02.m_begin = pvVar17;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_3c0,
                 msg_02);
      txc.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           txc.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           & 0xffffffffffffff00;
      txc.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&PTR__lazy_ostream_013ae088;
      sStack_1f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_1f0 = (_Base_ptr)0xf73bdc;
      local_210 = (undefined8 ***)
                  ((long)cluster.
                         super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   CONCAT44(cluster.
                            super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            cluster.
                            super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_4_) >> 3);
      local_3c8 = (long **)((long)zigzag_txids.
                                  super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)zigzag_txids.
                                  super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5);
      txp.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           CONCAT71(txp.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                    _1_7_,local_210 == (undefined8 ***)local_3c8);
      txp.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      sStack_3f8.pi_ = (sp_counted_base *)0x0;
      local_1d0._0_8_ =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_1d0.m_message.px = (element_type *)0xeaa460;
      local_1e8._8_8_ = &local_210;
      clusterset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           clusterset._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
      clusterset._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ae0c8;
      clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)boost::unit_test::lazy_ostream::inst;
      clusterset._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)(local_1e8 + 8);
      local_1e8._0_8_ = &local_3c8;
      tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi &
           0xffffffffffffff00;
      tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&PTR__lazy_ostream_013ae0c8;
      local_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      p_Stack_40 = (_Base_ptr)local_1e8;
      pvVar17 = (iterator)0x1;
      pvVar18 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&txp,(lazy_ostream *)&txc,1,2,REQUIRE,0xeab209,
                 (size_t)&local_1d0,0x285,
                 (set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,CompareIteratorByHash,std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>
                  *)&clusterset,"zigzag_txids.size()",(lazy_ostream *)&tx);
      boost::detail::shared_count::~shared_count(&sStack_3f8);
      __first._M_current._4_4_ =
           cluster.
           super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
           ._M_impl.super__Vector_impl_data._M_start._4_4_;
      __first._M_current._0_4_ =
           cluster.
           super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
           ._M_impl.super__Vector_impl_data._M_start._0_4_;
      std::
      set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,CompareIteratorByHash,std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>
      ::
      set<__gnu_cxx::__normal_iterator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>const*,std::vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost___i_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>>>
                ((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,CompareIteratorByHash,std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>
                  *)&clusterset,__first,
                 (__normal_iterator<_a80fa006_>)
                 cluster.
                 super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      local_3d8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_3d0 = "";
      local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_03.m_end = (iterator)0x287;
      file_03.m_begin = (iterator)&local_3d8;
      msg_03.m_end = pvVar18;
      msg_03.m_begin = pvVar17;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_3e8,
                 msg_03);
      txp.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           txp.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           & 0xffffffffffffff00;
      txp.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&PTR__lazy_ostream_013ae088;
      sStack_3f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_3f0 = (_Base_ptr)0xf73bdc;
      local_3c8 = (long **)((long)cluster.
                                  super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            CONCAT44(cluster.
                                     super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     cluster.
                                     super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_) >> 3);
      local_410 = (long **)CONCAT44(clusterset._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                    _4_4_,(undefined4)
                                          clusterset._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count);
      local_1d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)(local_3c8 == local_410);
      local_1d0.m_message.px = (element_type *)0x0;
      local_1d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_1e8._8_8_ =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
      ;
      local_1d8 = (_Base_ptr)0xeaa460;
      local_1e8._0_8_ = &local_3c8;
      tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi &
           0xffffffffffffff00;
      tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&PTR__lazy_ostream_013ae0c8;
      local_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      p_Stack_40 = (_Base_ptr)local_1e8;
      local_210 = &local_410;
      txc.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           txc.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           & 0xffffffffffffff00;
      txc.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&PTR__lazy_ostream_013ae0c8;
      sStack_1f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_1f0 = (_Base_ptr)&local_210;
      pvVar17 = (iterator)0x1;
      pvVar18 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                (&local_1d0,(lazy_ostream *)&txp,1,2,REQUIRE,0xeab209,(size_t)(local_1e8 + 8),0x287,
                 (lazy_ostream *)&tx,"clusterset.size()",&txc);
      boost::detail::shared_count::~shared_count(&local_1d0.m_message.pn);
      phVar19 = vec_iters_zigzag.
                super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (__k = vec_iters_zigzag.
                 super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; __k != phVar19; __k = __k + 1) {
        local_420 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_418 = "";
        local_430 = &boost::unit_test::basic_cstring<char_const>::null;
        local_428 = &boost::unit_test::basic_cstring<char_const>::null;
        file_04.m_end = (iterator)0x288;
        file_04.m_begin = (iterator)&local_420;
        msg_04.m_end = pvVar18;
        msg_04.m_begin = pvVar17;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_430
                   ,msg_04);
        _cVar21 = 0x45a528;
        cVar12 = std::_Rb_tree<$270907ca$>::find((_Rb_tree<_270907ca_> *)&clusterset,__k);
        txc.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             CONCAT71(txc.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                      _1_7_,(_Rb_tree_header *)cVar12._M_node !=
                            &clusterset._M_t._M_impl.super__Rb_tree_header);
        txc.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        sStack_1f8.pi_ = (sp_counted_base *)0x0;
        txp.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)anon_var_dwarf_cfd46c;
        txp.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xeab254;
        tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             & 0xffffffffffffff00;
        tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&PTR__lazy_ostream_013ae1c8;
        local_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        p_Stack_40 = (_Base_ptr)&txp;
        local_440 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniminer_tests.cpp"
        ;
        local_438 = "";
        pvVar17 = (iterator)0x1;
        pvVar18 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&txc,(lazy_ostream *)&tx,1,0,WARN,_cVar21,(size_t)&local_440,
                   0x288);
        boost::detail::shared_count::~shared_count(&sStack_1f8);
      }
      std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)&clusterset);
      pvVar8 = (void *)CONCAT44(cluster.
                                super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                cluster.
                                super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_4_);
      if (pvVar8 != (void *)0x0) {
        operator_delete(pvVar8,(long)cluster.
                                     super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar8);
      }
      puVar15 = puVar15 + 1;
    } while (puVar15 !=
             indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (vec_iters_zigzag.
      super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vec_iters_zigzag.
                    super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vec_iters_zigzag.
                          super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vec_iters_zigzag.
                          super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (zigzag_txids.
      super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(zigzag_txids.
                    super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)zigzag_txids.
                          super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)zigzag_txids.
                          super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (cluster_501.
      super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(cluster_501.
                    super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)cluster_501.
                          super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)cluster_501.
                          super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (tx_501.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (tx_501.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (vec_iters_500.
      super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vec_iters_500.
                    super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vec_iters_500.
                          super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vec_iters_500.
                          super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::_Rb_tree<$270907ca$>::~_Rb_tree(&cluster_500tx_set._M_t);
  if (cluster_500tx.
      super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(cluster_500tx.
                    super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)cluster_500tx.
                          super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)cluster_500tx.
                          super__Vector_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (chain_txids.
      super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(chain_txids.
                    super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)chain_txids.
                          super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)chain_txids.
                          super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(calculate_cluster, TestChain100Setup)
{
    CTxMemPool& pool = *Assert(m_node.mempool);
    LOCK2(cs_main, pool.cs);

    // TODO this can be removed once the mempool interface uses Txid, Wtxid
    auto convert_to_uint256_vec = [](const std::vector<Txid>& vec) -> std::vector<uint256> {
        std::vector<uint256> out;
        std::transform(vec.begin(), vec.end(), std::back_inserter(out),
                       [](const Txid& txid) { return txid.ToUint256(); });
        return out;
    };

    // Add chain of size 500
    TestMemPoolEntryHelper entry;
    std::vector<Txid> chain_txids;
    auto& lasttx = m_coinbase_txns[0];
    for (auto i{0}; i < 500; ++i) {
        const auto tx = make_tx({COutPoint{lasttx->GetHash(), 0}}, /*num_outputs=*/1);
        pool.addUnchecked(entry.Fee(CENT).FromTx(tx));
        chain_txids.push_back(tx->GetHash());
        lasttx = tx;
    }
    const auto cluster_500tx = pool.GatherClusters({lasttx->GetHash()});
    CTxMemPool::setEntries cluster_500tx_set{cluster_500tx.begin(), cluster_500tx.end()};
    BOOST_CHECK_EQUAL(cluster_500tx.size(), cluster_500tx_set.size());
    const auto vec_iters_500 = pool.GetIterVec(convert_to_uint256_vec(chain_txids));
    for (const auto& iter : vec_iters_500) BOOST_CHECK(cluster_500tx_set.count(iter));

    // GatherClusters stops at 500 transactions.
    const auto tx_501 = make_tx({COutPoint{lasttx->GetHash(), 0}}, /*num_outputs=*/1);
    pool.addUnchecked(entry.Fee(CENT).FromTx(tx_501));
    const auto cluster_501 = pool.GatherClusters({tx_501->GetHash()});
    BOOST_CHECK_EQUAL(cluster_501.size(), 0);

    /* Zig Zag cluster:
     * txp0     txp1     txp2    ...  txp48  txp49
     *    \    /    \   /   \            \   /
     *     txc0     txc1    txc2  ...    txc48
     * Note that each transaction's ancestor size is 1 or 3, and each descendant size is 1, 2 or 3.
     * However, all of these transactions are in the same cluster. */
    std::vector<Txid> zigzag_txids;
    for (auto p{0}; p < 50; ++p) {
        const auto txp = make_tx({COutPoint{Txid::FromUint256(GetRandHash()), 0}}, /*num_outputs=*/2);
        pool.addUnchecked(entry.Fee(CENT).FromTx(txp));
        zigzag_txids.push_back(txp->GetHash());
    }
    for (auto c{0}; c < 49; ++c) {
        const auto txc = make_tx({COutPoint{zigzag_txids[c], 1}, COutPoint{zigzag_txids[c+1], 0}}, /*num_outputs=*/1);
        pool.addUnchecked(entry.Fee(CENT).FromTx(txc));
        zigzag_txids.push_back(txc->GetHash());
    }
    const auto vec_iters_zigzag = pool.GetIterVec(convert_to_uint256_vec(zigzag_txids));
    // It doesn't matter which tx we calculate cluster for, everybody is in it.
    const std::vector<size_t> indices{0, 22, 72, zigzag_txids.size() - 1};
    for (const auto index : indices) {
        const auto cluster = pool.GatherClusters({zigzag_txids[index]});
        BOOST_CHECK_EQUAL(cluster.size(), zigzag_txids.size());
        CTxMemPool::setEntries clusterset{cluster.begin(), cluster.end()};
        BOOST_CHECK_EQUAL(cluster.size(), clusterset.size());
        for (const auto& iter : vec_iters_zigzag) BOOST_CHECK(clusterset.count(iter));
    }
}